

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeSetLinearSolver(void *cvode_mem,SUNLinearSolver LS,SUNMatrix A)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  CVLsMem cvls_mem_00;
  N_Vector p_Var4;
  long lVar5;
  SUNMatrix in_RDX;
  SUNLinearSolver in_RSI;
  CVodeMem in_RDI;
  int matrixbased;
  int iterative;
  int LSType;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  sunrealtype local_50;
  bool local_41;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x8c,"CVodeSetLinearSolver",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RSI == (SUNLinearSolver)0x0) {
    cvProcessError((CVodeMem)0x0,-3,0x92,"CVodeSetLinearSolver",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"LS must be non-NULL");
    local_4 = -3;
  }
  else if ((in_RSI->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
          (in_RSI->ops->solve ==
           (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    cvProcessError(in_RDI,-3,0x9b,"CVodeSetLinearSolver",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                   ,"LS object is missing a required operation");
    local_4 = -3;
  }
  else {
    iVar1 = SUNLinSolGetType(in_RSI);
    uVar2 = (uint)(iVar1 != 0);
    local_41 = iVar1 != 1 && iVar1 != 3;
    uVar3 = (uint)local_41;
    if ((in_RDI->cv_tempv->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) ||
       (in_RDI->cv_tempv->ops->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)) {
      cvProcessError(in_RDI,-3,0xac,"CVodeSetLinearSolver",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else if ((iVar1 == 3) && (in_RDX != (SUNMatrix)0x0)) {
      cvProcessError(in_RDI,-3,0xb4,"CVodeSetLinearSolver",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Incompatible inputs: matrix-embedded LS requires NULL matrix");
      local_4 = -3;
    }
    else {
      if (uVar2 == 0) {
        if (in_RDX == (SUNMatrix)0x0) {
          cvProcessError(in_RDI,-3,0xd4,"CVodeSetLinearSolver",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                         ,"Incompatible inputs: direct LS requires non-NULL matrix");
          return -3;
        }
      }
      else {
        if (in_RDI->cv_tempv->ops->nvgetlength == (_func_sunindextype_N_Vector *)0x0) {
          cvProcessError(in_RDI,-3,0xbe,"CVodeSetLinearSolver",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                         ,"A required vector operation is not implemented.");
          return -3;
        }
        if (((uVar3 == 0) && (iVar1 != 3)) &&
           (in_RSI->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0))
        {
          cvProcessError(in_RDI,-3,0xc6,"CVodeSetLinearSolver",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                         ,"Incompatible inputs: iterative LS must support ATimes routine");
          return -3;
        }
        if ((uVar3 != 0) && (in_RDX == (SUNMatrix)0x0)) {
          cvProcessError(in_RDI,-3,0xcd,"CVodeSetLinearSolver",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                         ,"Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
          return -3;
        }
      }
      if (in_RDI->cv_lfree != (_func_int_CVodeMemRec_ptr *)0x0) {
        (*in_RDI->cv_lfree)(in_RDI);
      }
      in_RDI->cv_linit = cvLsInitialize;
      in_RDI->cv_lsetup = cvLsSetup;
      in_RDI->cv_lsolve = cvLsSolve;
      in_RDI->cv_lfree = cvLsFree;
      cvls_mem_00 = (CVLsMem)malloc(0x140);
      if (cvls_mem_00 == (CVLsMem)0x0) {
        cvProcessError(in_RDI,-4,0xe7,"CVodeSetLinearSolver",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                       ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        memset(cvls_mem_00,0,0x140);
        cvls_mem_00->LS = in_RSI;
        cvls_mem_00->iterative = uVar2;
        cvls_mem_00->matrixbased = uVar3;
        if (in_RDX == (SUNMatrix)0x0) {
          cvls_mem_00->jacDQ = 0;
          cvls_mem_00->jac = (CVLsJacFn)0x0;
          cvls_mem_00->J_data = (void *)0x0;
        }
        else {
          cvls_mem_00->jacDQ = 1;
          cvls_mem_00->jac = cvLsDQJac;
          cvls_mem_00->J_data = in_RDI;
        }
        cvls_mem_00->jtimesDQ = 1;
        cvls_mem_00->jtsetup = (CVLsJacTimesSetupFn)0x0;
        cvls_mem_00->jtimes = cvLsDQJtimes;
        cvls_mem_00->jt_f = in_RDI->cv_f;
        cvls_mem_00->jt_data = in_RDI;
        cvls_mem_00->user_linsys = 0;
        cvls_mem_00->linsys = cvLsLinSys;
        cvls_mem_00->A_data = in_RDI;
        cvls_mem_00->pset = (CVLsPrecSetupFn)0x0;
        cvls_mem_00->psolve = (CVLsPrecSolveFn)0x0;
        cvls_mem_00->pfree = (_func_int_CVodeMem *)0x0;
        cvls_mem_00->P_data = in_RDI->cv_user_data;
        cvLsInitializeCounters(cvls_mem_00);
        cvls_mem_00->msbj = 0x33;
        cvls_mem_00->jbad = 1;
        cvls_mem_00->dgmax_jbad = 0.2;
        cvls_mem_00->eplifac = 0.05;
        cvls_mem_00->last_flag = 0;
        if ((in_RSI->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)
           || (iVar1 = SUNLinSolSetATimes(in_RSI,in_RDI,cvLsATimes), iVar1 == 0)) {
          if ((in_RSI->ops->setpreconditioner ==
               (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
             (iVar1 = SUNLinSolSetPreconditioner(in_RSI,in_RDI,0), iVar1 == 0)) {
            if (in_RDX != (SUNMatrix)0x0) {
              cvls_mem_00->A = in_RDX;
              cvls_mem_00->savedJ = (SUNMatrix)0x0;
            }
            p_Var4 = (N_Vector)N_VClone(in_RDI->cv_tempv);
            cvls_mem_00->ytemp = p_Var4;
            if (cvls_mem_00->ytemp == (N_Vector)0x0) {
              cvProcessError(in_RDI,-4,0x143,"CVodeSetLinearSolver",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                             ,"A memory request failed.");
              free(cvls_mem_00);
              local_4 = -4;
            }
            else {
              p_Var4 = (N_Vector)N_VClone(in_RDI->cv_tempv);
              cvls_mem_00->x = p_Var4;
              if (cvls_mem_00->x == (N_Vector)0x0) {
                cvProcessError(in_RDI,-4,0x14d,"CVodeSetLinearSolver",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                               ,"A memory request failed.");
                N_VDestroy(cvls_mem_00->ytemp);
                free(cvls_mem_00);
                local_4 = -4;
              }
              else {
                if (uVar2 != 0) {
                  lVar5 = N_VGetLength(cvls_mem_00->ytemp);
                  if (0.0 < (double)lVar5) {
                    lVar5 = N_VGetLength(cvls_mem_00->ytemp);
                    local_50 = sqrt((double)lVar5);
                  }
                  else {
                    local_50 = 0.0;
                  }
                  cvls_mem_00->nrmfac = local_50;
                }
                if ((uVar3 == 0) || (in_RDI->cv_lmm != 2)) {
                  cvls_mem_00->scalesol = 0;
                }
                else {
                  cvls_mem_00->scalesol = 1;
                }
                in_RDI->cv_lmem = cvls_mem_00;
                local_4 = 0;
              }
            }
          }
          else {
            cvProcessError(in_RDI,-9,0x130,"CVodeSetLinearSolver",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                           ,"Error in calling SUNLinSolSetPreconditioner");
            free(cvls_mem_00);
            local_4 = -9;
          }
        }
        else {
          cvProcessError(in_RDI,-9,0x122,"CVodeSetLinearSolver",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                         ,"Error in calling SUNLinSolSetATimes");
          free(cvls_mem_00);
          local_4 = -9;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int CVodeSetLinearSolver(void* cvode_mem, SUNLinearSolver LS, SUNMatrix A)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval, LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if either cvode_mem or LS inputs are NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_CVMEM_NULL);
    return (CVLS_MEM_NULL);
  }
  if (LS == NULL)
  {
    cvProcessError(NULL, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "LS must be non-NULL");
    return (CVLS_ILL_INPUT);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "LS object is missing a required operation");
    return (CVLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ((cv_mem->cv_tempv->ops->nvconst == NULL) ||
      (cv_mem->cv_tempv->ops->nvwrmsnorm == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSG_LS_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Ensure that A is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (A != NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                   __FILE__, "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return (CVLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if (cv_mem->cv_tempv->ops->nvgetlength == NULL)
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSG_LS_BAD_NVECTOR);
      return (CVLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL))
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                     __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (CVLS_ILL_INPUT);
    }

    if (matrixbased && (A == NULL))
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                     __FILE__, "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return (CVLS_ILL_INPUT);
    }
  }
  else if (A == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Incompatible inputs: direct LS requires non-NULL matrix");
    return (CVLS_ILL_INPUT);
  }

  /* free any existing system solver attached to CVode */
  if (cv_mem->cv_lfree) { cv_mem->cv_lfree(cv_mem); }

  /* Set four main system linear solver function fields in cv_mem */
  cv_mem->cv_linit  = cvLsInitialize;
  cv_mem->cv_lsetup = cvLsSetup;
  cv_mem->cv_lsolve = cvLsSolve;
  cv_mem->cv_lfree  = cvLsFree;

  /* Allocate memory for CVLsMemRec */
  cvls_mem = NULL;
  cvls_mem = (CVLsMem)malloc(sizeof(struct CVLsMemRec));
  if (cvls_mem == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  memset(cvls_mem, 0, sizeof(struct CVLsMemRec));

  /* set SUNLinearSolver pointer */
  cvls_mem->LS = LS;

  /* Linear solver type information */
  cvls_mem->iterative   = iterative;
  cvls_mem->matrixbased = matrixbased;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL)
  {
    cvls_mem->jacDQ  = SUNTRUE;
    cvls_mem->jac    = cvLsDQJac;
    cvls_mem->J_data = cv_mem;
  }
  else
  {
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = NULL;
    cvls_mem->J_data = NULL;
  }

  cvls_mem->jtimesDQ = SUNTRUE;
  cvls_mem->jtsetup  = NULL;
  cvls_mem->jtimes   = cvLsDQJtimes;
  cvls_mem->jt_f     = cv_mem->cv_f;
  cvls_mem->jt_data  = cv_mem;

  cvls_mem->user_linsys = SUNFALSE;
  cvls_mem->linsys      = cvLsLinSys;
  cvls_mem->A_data      = cv_mem;

  /* Set defaults for preconditioner-related fields */
  cvls_mem->pset   = NULL;
  cvls_mem->psolve = NULL;
  cvls_mem->pfree  = NULL;
  cvls_mem->P_data = cv_mem->cv_user_data;

  /* Initialize counters */
  cvLsInitializeCounters(cvls_mem);

  /* Set default values for the rest of the LS parameters */
  cvls_mem->msbj       = CVLS_MSBJ;
  cvls_mem->jbad       = SUNTRUE;
  cvls_mem->dgmax_jbad = CVLS_DGMAX;
  cvls_mem->eplifac    = CVLS_EPLIN;
  cvls_mem->last_flag  = CVLS_SUCCESS;

  /* If LS supports ATimes, attach CVLs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, cv_mem, cvLsATimes);
    if (retval != SUN_SUCCESS)
    {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                     "Error in calling SUNLinSolSetATimes");
      free(cvls_mem);
      cvls_mem = NULL;
      return (CVLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, cv_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                     "Error in calling SUNLinSolSetPreconditioner");
      free(cvls_mem);
      cvls_mem = NULL;
      return (CVLS_SUNLS_FAIL);
    }
  }

  /* When using a SUNMatrix object, store pointer to A and initialize savedJ */
  if (A != NULL)
  {
    cvls_mem->A      = A;
    cvls_mem->savedJ = NULL; /* allocated in cvLsInitialize */
  }

  /* Allocate memory for ytemp and x */
  cvls_mem->ytemp = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->ytemp == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    free(cvls_mem);
    cvls_mem = NULL;
    return (CVLS_MEM_FAIL);
  }

  cvls_mem->x = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->x == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    N_VDestroy(cvls_mem->ytemp);
    free(cvls_mem);
    cvls_mem = NULL;
    return (CVLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative) { cvls_mem->nrmfac = SUNRsqrt(N_VGetLength(cvls_mem->ytemp)); }

  /* Check if solution scaling should be enabled */
  if (matrixbased && cv_mem->cv_lmm == CV_BDF) { cvls_mem->scalesol = SUNTRUE; }
  else { cvls_mem->scalesol = SUNFALSE; }

  /* Attach linear solver memory to integrator memory */
  cv_mem->cv_lmem = cvls_mem;

  return (CVLS_SUCCESS);
}